

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_re.c
# Opt level: O2

int pull_by_re(char *input_file,char *aStrRegex,int min,int max,int length,int exclude,int convert,
              int just_count)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  gzFile pgVar4;
  kseq_t *seq;
  kstream_t *pkVar5;
  uchar *puVar6;
  pcre2_code_8 *re;
  uint uVar7;
  char *__ptr;
  int errornumber;
  gzFile local_148;
  size_t erroroffset;
  PCRE2_UCHAR8 buffer [256];
  
  pgVar4 = (gzFile)gzopen(input_file,"r");
  if (pgVar4 == (gzFile)0x0) {
    fprintf(_stderr,"%s - Couldn\'t open fasta file %s\n",progname,input_file);
  }
  else {
    seq = (kseq_t *)calloc(1,0x70);
    pkVar5 = (kstream_t *)calloc(1,0x20);
    pkVar5->f = pgVar4;
    puVar6 = (uchar *)malloc(0xffff);
    pkVar5->buf = puVar6;
    seq->f = pkVar5;
    kseq_read(seq);
    pcVar2 = (seq->qual).s;
    local_148 = pgVar4;
    gzrewind();
    pkVar5 = seq->f;
    pkVar5->begin = 0;
    pkVar5->end = 0;
    pkVar5->is_eof = 0;
    seq->last_char = 0;
    if (verbose_flag != 0) {
      __ptr = "Input is FASTQ format\n";
      if (pcVar2 == (char *)0x0) {
        __ptr = "Input is FASTA format\n";
      }
      fwrite(__ptr,0x16,1,_stderr);
    }
    re = (pcre2_code_8 *)pcre2_compile_8(aStrRegex,0xffffffffffffffff,0,&errornumber,&erroroffset,0)
    ;
    if (re != (pcre2_code_8 *)0x0) {
      uVar1 = 0;
      uVar7 = 0;
      do {
        while( true ) {
          iVar3 = kseq_read(seq);
          if (iVar3 < 0) {
            pcre2_code_free_8(re);
            free((seq->name).s);
            free((seq->comment).s);
            free((seq->seq).s);
            free((seq->qual).s);
            pkVar5 = seq->f;
            if (pkVar5 != (kstream_t *)0x0) {
              free(pkVar5->buf);
              free(pkVar5);
            }
            free(seq);
            gzclose(local_148);
            if (just_count != 0) {
              fprintf(_stdout,"Total output: %i\n",(ulong)uVar7);
              fprintf(_stdout,"Total excluded: %i\n",(ulong)uVar1);
            }
            return uVar7;
          }
          iVar3 = search_header(re,(seq->name).s);
          if (exclude == 0) break;
          if (iVar3 == 0) {
            iVar3 = search_header(re,(seq->comment).s);
            if (iVar3 == 0) goto LAB_001044cd;
          }
LAB_001044b3:
          uVar1 = uVar1 + 1;
        }
        if (iVar3 == 0) {
          iVar3 = search_header(re,(seq->comment).s);
          if (iVar3 == 0) goto LAB_001044b3;
        }
LAB_001044cd:
        iVar3 = size_filter(seq,(uint)(pcVar2 == (char *)0x0),min,max,length,convert,just_count);
        uVar7 = uVar7 + iVar3;
      } while( true );
    }
    pcre2_get_error_message_8(errornumber,buffer,0x100);
    fprintf(_stderr,"PCRE2 compilation failed at offset %d: %s\n",(ulong)(uint)erroroffset,buffer);
  }
  exit(1);
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_re(char *input_file, char *aStrRegex, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* pcre2 variables */
	pcre2_code *re; // the regex object
	PCRE2_SIZE erroroffset;
	int errornumber;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

        if (verbose_flag) {
            if (is_fasta)
                fprintf(stderr, "Input is FASTA format\n");
            else
                fprintf(stderr, "Input is FASTQ format\n");
        }

	/* initialize the re */
	re = pcre2_compile(
			aStrRegex,             /* the pattern */
			PCRE2_ZERO_TERMINATED, /* indicates pattern is zero-terminated */
			0,                     /* default options */
			&errornumber,          /* for error num */
			&erroroffset,          /* err offset */
			NULL);                 /* default compile context */

	if (re == NULL) {
		  PCRE2_UCHAR buffer[256];
		  pcre2_get_error_message(errornumber, buffer, sizeof(buffer));
		  fprintf(stderr, "PCRE2 compilation failed at offset %d: %s\n", (int)erroroffset, buffer);
		  exit(EXIT_FAILURE);
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude) {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s))
				excluded++;
			else {
				/* regex doesn't match, so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			}
		} else {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s)) {
				/* regex matches so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			} else
				excluded++;
		}
	} /* end of seq traversal */

	/* tear down re */
	pcre2_code_free(re); /* free up the re */

	kseq_destroy(seq);
	gzclose(fp); /* done reading file so close */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}